

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

void __thiscall ctemplate_htmlparser::HtmlparserCppTest::TearDown(HtmlparserCppTest *this)

{
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->contextMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    puVar1 = *(undefined8 **)(p_Var2 + 2);
    if (puVar1 != (undefined8 *)0x0) {
      ctemplate_htmlparser::htmlparser_delete((htmlparser_ctx_s *)*puVar1);
    }
    operator_delete(puVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
           *)this);
  return;
}

Assistant:

void TearDown() {
    // Delete all parser instances from the context map
    for (ContextMap::iterator iter = contextMap.begin();
        iter != contextMap.end(); ++iter) {
      delete iter->second;
    }
    contextMap.clear();
  }